

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O0

bool Js::VarIs<Js::JavascriptNumberObject,Js::RecyclableObject>(RecyclableObject *obj)

{
  bool bVar1;
  RecyclableObject *obj_local;
  
  bVar1 = VarIsImpl<Js::JavascriptNumberObject>(obj);
  return bVar1;
}

Assistant:

bool VarIs(U* obj)
    {
        // ChakraFull can't include type_traits, but ChakraCore does include it for debug builds
#if DBG && !defined(NTBUILD)
        static_assert(!std::is_same<T, U>::value, "Check should be unnecessary - did you prematurely cast?");
        static_assert(std::is_base_of<U, T>::value, "VarIs/VarTo should only downcast!");
#endif
        return VarIsImpl<T>(obj);
    }